

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::arena_delete_object<std::__cxx11::string>(void *object)

{
  string *in_RDI;
  
  if (in_RDI != (string *)0x0) {
    std::__cxx11::string::~string(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void arena_delete_object(void* object) {
  delete reinterpret_cast<T*>(object);
}